

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

ER __thiscall slang::ast::BlockStatement::evalImpl(BlockStatement *this,EvalContext *context)

{
  SourceRange range;
  Symbol *pSVar1;
  EvalContext *in_RSI;
  long in_RDI;
  DiagCode unaff_retaddr;
  Symbol *target;
  ER result;
  EvalContext *in_stack_ffffffffffffff98;
  Statement *in_stack_ffffffffffffffa0;
  SourceRange local_50;
  ER local_34;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)(in_RDI + 0x30) == 0) {
    local_34 = Statement::eval(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if ((local_34 == Disable) &&
       (pSVar1 = EvalContext::getDisableTarget(in_RSI), pSVar1 == *(Symbol **)(in_RDI + 0x28))) {
      local_34 = Success;
      SourceRange::SourceRange((SourceRange *)in_RSI);
      EvalContext::setDisableTarget(in_RSI,(Symbol *)0x0,local_50);
    }
  }
  else {
    range.endLoc._0_4_ = in_stack_fffffffffffffff8;
    range.startLoc = (SourceLocation)in_RDI;
    range.endLoc._4_4_ = in_stack_fffffffffffffffc;
    EvalContext::addDiag(in_RSI,unaff_retaddr,range);
    local_34 = Fail;
  }
  return local_34;
}

Assistant:

ER BlockStatement::evalImpl(EvalContext& context) const {
    if (blockKind != StatementBlockKind::Sequential) {
        context.addDiag(diag::ConstEvalParallelBlockNotConst, sourceRange);
        return ER::Fail;
    }

    ER result = body.eval(context);
    if (result == ER::Disable) {
        // Check if the disable statement we evaluated was targeting this block.
        // If it was, we've already skipped enough statements, so just clear out
        // the target and continue on.
        auto target = context.getDisableTarget();
        SLANG_ASSERT(target);
        if (target == blockSymbol) {
            result = ER::Success;
            context.setDisableTarget(nullptr, {});
        }
    }

    return result;
}